

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

FeatureOptions<wasm::SIMDReplaceOp> * __thiscall
wasm::Random::FeatureOptions<wasm::SIMDReplaceOp>::add<wasm::SIMDReplaceOp,wasm::SIMDReplaceOp>
          (FeatureOptions<wasm::SIMDReplaceOp> *this,FeatureSet feature,SIMDReplaceOp option,
          SIMDReplaceOp rest,SIMDReplaceOp rest_1)

{
  iterator __position;
  vector<wasm::SIMDReplaceOp,std::allocator<wasm::SIMDReplaceOp>> *this_00;
  FeatureOptions<wasm::SIMDReplaceOp> *pFVar1;
  key_type local_30;
  SIMDReplaceOp local_2c;
  FeatureSet feature_local;
  SIMDReplaceOp option_local;
  
  local_30.features = feature.features;
  local_2c = option;
  this_00 = (vector<wasm::SIMDReplaceOp,std::allocator<wasm::SIMDReplaceOp>> *)
            std::
            map<wasm::FeatureSet,_std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>_>_>_>
            ::operator[](&this->options,&local_30);
  __position._M_current = *(SIMDReplaceOp **)(this_00 + 8);
  if (__position._M_current == *(SIMDReplaceOp **)(this_00 + 0x10)) {
    std::vector<wasm::SIMDReplaceOp,std::allocator<wasm::SIMDReplaceOp>>::
    _M_realloc_insert<wasm::SIMDReplaceOp_const&>(this_00,__position,&local_2c);
  }
  else {
    *__position._M_current = option;
    *(SIMDReplaceOp **)(this_00 + 8) = __position._M_current + 1;
  }
  pFVar1 = add<wasm::SIMDReplaceOp>(this,(FeatureSet)local_30.features,rest,rest_1);
  return pFVar1;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }